

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotScatterEx<ImPlot::GetterYs<unsigned_long_long>>
               (char *label_id,GetterYs<unsigned_long_long> *getter)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  ImVec2 IVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  TransformerLogLog transformer;
  unsigned_long_long *puVar10;
  ImPlotPlot *pIVar11;
  unsigned_long_long uVar12;
  double dVar13;
  double dVar14;
  ImPlotRange *pIVar15;
  ImPlotContext *pIVar16;
  undefined1 auVar17 [16];
  bool bVar18;
  uint uVar19;
  uint uVar20;
  ImU32 col_mk_line;
  ImU32 col_mk_fill;
  ImPlotContext *pIVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  float fVar28;
  float fVar29;
  double dVar30;
  double dVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  undefined1 auVar37 [16];
  undefined8 local_98;
  ImDrawList *local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  uint local_5c;
  double local_58;
  undefined8 uStack_50;
  unsigned_long_long *local_48;
  double dStack_40;
  
  bVar18 = BeginItem(label_id,2);
  pIVar21 = GImPlot;
  if (bVar18) {
    if ((GImPlot->FitThisFrame == true) && (iVar6 = getter->Count, 0 < iVar6)) {
      dVar31 = getter->X0;
      dVar30 = getter->XScale;
      puVar10 = getter->Ys;
      iVar24 = getter->Offset;
      iVar7 = getter->Stride;
      pIVar11 = GImPlot->CurrentPlot;
      iVar25 = pIVar11->CurrentYAxis;
      uVar8 = (pIVar11->XAxis).Flags;
      pIVar15 = GImPlot->ExtentsY;
      uVar9 = pIVar11->YAxis[iVar25].Flags;
      iVar23 = 0;
      uVar22 = uVar9 & 0x20;
      uVar19 = uVar22 >> 5;
      local_88._0_4_ = uVar19;
      auVar17 = local_88;
      uVar20 = uVar8 & 0x20;
      local_78._0_4_ = uVar20;
      dVar34 = 0.0;
      do {
        dVar36 = dVar30 * dVar34 + dVar31;
        uVar12 = *(unsigned_long_long *)
                  ((long)puVar10 + (long)(((iVar24 + iVar23) % iVar6 + iVar6) % iVar6) * (long)iVar7
                  );
        auVar37._8_4_ = (int)(uVar12 >> 0x20);
        auVar37._0_8_ = uVar12;
        auVar37._12_4_ = 0x45300000;
        dVar35 = (auVar37._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0);
        if ((uVar8 >> 10 & 1) == 0) {
          if ((long)ABS(dVar36) < 0x7ff0000000000000) {
LAB_001d0dfc:
            if ((0.0 < dVar36) || (uVar20 == 0)) {
              dVar13 = (pIVar21->ExtentsX).Min;
              dVar14 = (pIVar21->ExtentsX).Max;
              uVar26 = -(ulong)(dVar36 < dVar13);
              uVar27 = -(ulong)(dVar14 < dVar36);
              (pIVar21->ExtentsX).Min = (double)(~uVar26 & (ulong)dVar13 | (ulong)dVar36 & uVar26);
              (pIVar21->ExtentsX).Max = (double)(~uVar27 & (ulong)dVar14 | (ulong)dVar36 & uVar27);
            }
          }
        }
        else if ((((long)ABS(dVar36) < 0x7ff0000000000000) &&
                 (pIVar11->YAxis[iVar25].Range.Min <= dVar35)) &&
                (dVar35 <= pIVar11->YAxis[iVar25].Range.Max)) goto LAB_001d0dfc;
        if ((uVar9 >> 10 & 1) == 0) {
          if ((uVar12 != 0) || (uVar22 == 0)) {
LAB_001d0e87:
            dVar36 = pIVar15[iVar25].Min;
            dVar13 = pIVar21->ExtentsY[iVar25].Max;
            uVar26 = -(ulong)(dVar35 < dVar36);
            uVar27 = -(ulong)(dVar13 < dVar35);
            pIVar15[iVar25].Min = (double)(~uVar26 & (ulong)dVar36 | (ulong)dVar35 & uVar26);
            pIVar21->ExtentsY[iVar25].Max =
                 (double)(~uVar27 & (ulong)dVar13 | (ulong)dVar35 & uVar27);
          }
        }
        else if ((((pIVar11->XAxis).Range.Min <= dVar36) && (dVar36 <= (pIVar11->XAxis).Range.Max))
                && (local_88[0] = (byte)uVar19, (uVar12 == 0 & local_88[0]) == 0))
        goto LAB_001d0e87;
        dVar34 = dVar34 + 1.0;
        iVar23 = iVar23 + 1;
        local_88 = auVar17;
      } while (iVar6 != iVar23);
    }
    local_90 = GetPlotDrawList();
    iVar6 = (pIVar21->NextItemData).Marker;
    iVar24 = 0;
    if (iVar6 != -1) {
      iVar24 = iVar6;
    }
    PopPlotClipRect();
    PushPlotClipRect((pIVar21->NextItemData).MarkerSize);
    col_mk_line = ImGui::GetColorU32((pIVar21->NextItemData).Colors + 2);
    col_mk_fill = ImGui::GetColorU32((pIVar21->NextItemData).Colors + 3);
    pIVar16 = GImPlot;
    transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
    switch(GImPlot->Scales[transformer.YAxis]) {
    case 0:
      iVar6 = getter->Count;
      if (0 < iVar6) {
        puVar10 = getter->Ys;
        dVar31 = getter->XScale;
        local_48 = (unsigned_long_long *)getter->X0;
        uVar32 = SUB84(local_48,0);
        uVar33 = (undefined4)((ulong)local_48 >> 0x20);
        dVar30 = (double)(ulong)(uint)getter->Offset;
        fVar1 = (pIVar21->NextItemData).MarkerSize;
        fVar2 = (pIVar21->NextItemData).MarkerWeight;
        iVar7 = getter->Stride;
        iVar25 = 0;
        dVar34 = 0.0;
        bVar18 = (pIVar21->NextItemData).RenderMarkerLine;
        bVar5 = (pIVar21->NextItemData).RenderMarkerFill;
        local_78._0_8_ = dVar31;
        pIVar21 = GImPlot;
        local_58 = dVar30;
        do {
          uVar12 = *(unsigned_long_long *)
                    ((long)puVar10 +
                    (long)(((SUB84(dVar30,0) + iVar25) % iVar6 + iVar6) % iVar6) * (long)iVar7);
          IVar4 = pIVar21->PixelRange[transformer.YAxis].Min;
          fVar28 = (float)(pIVar21->Mx *
                           ((dVar31 * dVar34 + (double)CONCAT44(uVar33,uVar32)) -
                           (pIVar21->CurrentPlot->XAxis).Range.Min) + (double)IVar4.x);
          fVar29 = (float)(pIVar21->My[transformer.YAxis] *
                           ((((double)CONCAT44(0x45300000,(int)(uVar12 >> 0x20)) -
                             1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0)) -
                           pIVar21->CurrentPlot->YAxis[transformer.YAxis].Range.Min) +
                          (double)IVar4.y);
          local_98 = CONCAT44(fVar29,fVar28);
          pIVar11 = pIVar16->CurrentPlot;
          if ((((pIVar11->PlotRect).Min.x <= fVar28) && ((pIVar11->PlotRect).Min.y <= fVar29)) &&
             ((fVar28 < (pIVar11->PlotRect).Max.x && (fVar29 < (pIVar11->PlotRect).Max.y)))) {
            local_88._0_8_ = dVar34;
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterYs<unsigned_long_long>>(ImPlot::GetterYs<unsigned_long_long>,ImPlot::TransformerLinLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + (long)iVar24 * 8))
                      (fVar1,fVar2,local_90,&local_98,bVar18,col_mk_line,bVar5,col_mk_fill);
            uVar32 = SUB84(local_48,0);
            uVar33 = (undefined4)((ulong)local_48 >> 0x20);
            pIVar21 = GImPlot;
            dVar30 = local_58;
            dVar34 = (double)local_88._0_8_;
            dVar31 = (double)local_78._0_8_;
          }
          dVar34 = dVar34 + 1.0;
          iVar25 = iVar25 + 1;
        } while (iVar6 != iVar25);
      }
      break;
    case 1:
      iVar6 = getter->Count;
      if (0 < iVar6) {
        local_48 = getter->Ys;
        local_58 = getter->XScale;
        dVar31 = getter->X0;
        iVar7 = getter->Offset;
        fVar1 = (pIVar21->NextItemData).MarkerSize;
        fVar2 = (pIVar21->NextItemData).MarkerWeight;
        iVar25 = getter->Stride;
        iVar23 = 0;
        dVar30 = 0.0;
        bVar18 = (pIVar21->NextItemData).RenderMarkerLine;
        local_5c = (uint)(pIVar21->NextItemData).RenderMarkerFill;
        do {
          pIVar21 = GImPlot;
          local_88._0_8_ = dVar30;
          uVar12 = *(unsigned_long_long *)
                    ((long)local_48 +
                    (long)(((iVar7 + iVar23) % iVar6 + iVar6) % iVar6) * (long)iVar25);
          dVar34 = (double)CONCAT44(0x45300000,(int)(uVar12 >> 0x20)) - 1.9342813113834067e+25;
          local_78._8_4_ = SUB84(dVar34 + dVar34,0);
          local_78._0_8_ = dVar34 + ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0);
          local_78._12_4_ = (int)((ulong)(dVar34 + dVar34) >> 0x20);
          dVar30 = log10((local_58 * dVar30 + dVar31) / (GImPlot->CurrentPlot->XAxis).Range.Min);
          pIVar11 = pIVar21->CurrentPlot;
          dVar34 = (pIVar11->XAxis).Range.Min;
          IVar4 = pIVar21->PixelRange[transformer.YAxis].Min;
          fVar28 = (float)(pIVar21->Mx *
                           (((double)(float)(dVar30 / pIVar21->LogDenX) *
                             ((pIVar11->XAxis).Range.Max - dVar34) + dVar34) - dVar34) +
                          (double)IVar4.x);
          fVar29 = (float)(pIVar21->My[transformer.YAxis] *
                           ((double)local_78._0_8_ - pIVar11->YAxis[transformer.YAxis].Range.Min) +
                          (double)IVar4.y);
          local_98 = CONCAT44(fVar29,fVar28);
          pIVar11 = pIVar16->CurrentPlot;
          if ((((pIVar11->PlotRect).Min.x <= fVar28) && ((pIVar11->PlotRect).Min.y <= fVar29)) &&
             ((fVar28 < (pIVar11->PlotRect).Max.x && (fVar29 < (pIVar11->PlotRect).Max.y)))) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterYs<unsigned_long_long>>(ImPlot::GetterYs<unsigned_long_long>,ImPlot::TransformerLogLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + (long)iVar24 * 8))
                      (fVar1,fVar2,local_90,&local_98,bVar18,col_mk_line,local_5c,col_mk_fill);
          }
          dVar30 = (double)local_88._0_8_ + 1.0;
          iVar23 = iVar23 + 1;
        } while (iVar6 != iVar23);
      }
      break;
    case 2:
      iVar6 = getter->Count;
      if (0 < iVar6) {
        local_78._0_8_ = getter->Ys;
        local_48 = (unsigned_long_long *)getter->XScale;
        dStack_40 = getter->X0;
        local_58 = getter->X0;
        uStack_50._0_4_ = getter->Offset;
        uStack_50._4_4_ = getter->Stride;
        iVar7 = getter->Offset;
        fVar1 = (pIVar21->NextItemData).MarkerSize;
        fVar2 = (pIVar21->NextItemData).MarkerWeight;
        iVar25 = getter->Stride;
        iVar23 = 0;
        dVar31 = 0.0;
        local_88._8_4_ = 0;
        local_88._12_4_ = 0;
        bVar18 = (pIVar21->NextItemData).RenderMarkerLine;
        bVar5 = (pIVar21->NextItemData).RenderMarkerFill;
        do {
          pIVar21 = GImPlot;
          local_88._0_8_ = dVar31;
          uVar3 = *(undefined8 *)
                   (local_78._0_8_ +
                   (long)(((iVar7 + iVar23) % iVar6 + iVar6) % iVar6) * (long)iVar25);
          dVar30 = log10((((double)CONCAT44(0x45300000,(int)((ulong)uVar3 >> 0x20)) -
                          1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                         GImPlot->CurrentPlot->YAxis[transformer.YAxis].Range.Min);
          pIVar11 = pIVar21->CurrentPlot;
          dVar31 = pIVar11->YAxis[transformer.YAxis].Range.Min;
          IVar4 = pIVar21->PixelRange[transformer.YAxis].Min;
          fVar28 = (float)(pIVar21->Mx *
                           ((local_58 + local_88._0_8_ * (double)local_48) -
                           (pIVar11->XAxis).Range.Min) + (double)IVar4.x);
          fVar29 = (float)(pIVar21->My[transformer.YAxis] *
                           ((dVar31 + (double)(float)(dVar30 / pIVar21->LogDenY[transformer.YAxis])
                                      * (pIVar11->YAxis[transformer.YAxis].Range.Max - dVar31)) -
                           dVar31) + (double)IVar4.y);
          local_98 = CONCAT44(fVar29,fVar28);
          pIVar11 = pIVar16->CurrentPlot;
          if (((((pIVar11->PlotRect).Min.x <= fVar28) &&
               (uVar3 = *(undefined8 *)&(pIVar11->PlotRect).Min.y, (float)uVar3 <= fVar29)) &&
              (fVar28 < (float)((ulong)uVar3 >> 0x20))) && (fVar29 < (pIVar11->PlotRect).Max.y)) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterYs<unsigned_long_long>>(ImPlot::GetterYs<unsigned_long_long>,ImPlot::TransformerLinLog,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + (long)iVar24 * 8))
                      (fVar1,fVar2,local_90,&local_98,bVar18,col_mk_line,bVar5,col_mk_fill);
          }
          dVar31 = (double)CONCAT44(local_88._4_4_,local_88._0_4_) + 1.0;
          iVar23 = iVar23 + 1;
        } while (iVar6 != iVar23);
      }
      break;
    case 3:
      RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterYs<unsigned_long_long>>
                (*getter,transformer,local_90,iVar24,(pIVar21->NextItemData).MarkerSize,
                 (pIVar21->NextItemData).RenderMarkerLine,col_mk_line,
                 (pIVar21->NextItemData).MarkerWeight,(pIVar21->NextItemData).RenderMarkerFill,
                 col_mk_fill);
    }
    pIVar21 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar21->NextItemData);
    pIVar21->PreviousItem = pIVar21->CurrentItem;
    pIVar21->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotScatterEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id, ImPlotCol_MarkerOutline)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(p);
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render markers
        ImPlotMarker marker = s.Marker == ImPlotMarker_None ? ImPlotMarker_Circle : s.Marker;
        if (marker != ImPlotMarker_None) {
            PopPlotClipRect();
            PushPlotClipRect(s.MarkerSize);
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(getter, TransformerLinLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(getter, TransformerLogLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(getter, TransformerLinLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(getter, TransformerLogLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}